

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
CLI::Option::as<std::__cxx11::string>(Option *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a8;
  Option *in_stack_000000b0;
  
  ::std::__cxx11::string::string(in_RDI);
  results<std::__cxx11::string>(in_stack_000000b0,in_stack_000000a8);
  return in_RDI;
}

Assistant:

CLI11_NODISCARD T as() const {
        T output;
        results(output);
        return output;
    }